

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O2

IterateResult __thiscall deqp::gls::MultiTextureSamplerTest::iterate(MultiTextureSamplerTest *this)

{
  TestLog *log;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *description;
  Surface samplerResult;
  Surface textureResult;
  Surface samplerRef;
  Surface textureRef;
  RGBA local_84;
  Surface local_80;
  Surface local_68;
  Surface local_50;
  Surface local_38;
  
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  tcu::Surface::Surface(&local_38,0x80,0x80);
  tcu::Surface::Surface(&local_50,0x80,0x80);
  tcu::Surface::Surface(&local_68,0x80,0x80);
  tcu::Surface::Surface(&local_80,0x80,0x80);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = de::Random::getInt(&this->m_random,0,*(int *)CONCAT44(extraout_var,iVar3) + -0x80);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = de::Random::getInt(&this->m_random,0,*(int *)(CONCAT44(extraout_var_00,iVar4) + 4) + -0x80
                            );
  renderReferences(this,&local_38,&local_50,iVar3,iVar4);
  renderResults(this,&local_68,&local_80,iVar3,iVar4);
  local_84.m_value = 0;
  bVar1 = tcu::pixelThresholdCompare
                    (log,"Sampler render result","Result from rendering with sampler",&local_50,
                     &local_80,&local_84,COMPARE_LOG_RESULT);
  local_84.m_value = 0;
  bVar2 = tcu::pixelThresholdCompare
                    (log,"Texture render result","Result from rendering with texture state",
                     &local_38,&local_68,&local_84,COMPARE_LOG_RESULT);
  description = "Fail";
  if (bVar1 && bVar2) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)(!bVar1 || !bVar2),description);
  tcu::Surface::~Surface(&local_80);
  tcu::Surface::~Surface(&local_68);
  tcu::Surface::~Surface(&local_50);
  tcu::Surface::~Surface(&local_38);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult MultiTextureSamplerTest::iterate (void)
{
	tcu::TestLog&	log = m_testCtx.getLog();

	tcu::Surface	textureRef(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	tcu::Surface	samplerRef(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);

	tcu::Surface	textureResult(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	tcu::Surface	samplerResult(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);

	int				x = m_random.getInt(0, m_renderCtx.getRenderTarget().getWidth() - VIEWPORT_WIDTH);
	int				y = m_random.getInt(0, m_renderCtx.getRenderTarget().getHeight() - VIEWPORT_HEIGHT);

	renderReferences(textureRef, samplerRef, x, y);
	renderResults(textureResult, samplerResult, x, y);

	bool isOk = pixelThresholdCompare (log, "Sampler render result", "Result from rendering with sampler", samplerRef, samplerResult, tcu::RGBA(0, 0, 0, 0), tcu::COMPARE_LOG_RESULT);

	if (!pixelThresholdCompare (log, "Texture render result", "Result from rendering with texture state", textureRef, textureResult, tcu::RGBA(0, 0, 0, 0), tcu::COMPARE_LOG_RESULT))
		isOk = false;

	if (!isOk)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}